

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

string * leveldb::MakeFileName
                   (string *__return_storage_ptr__,string *dbname,uint64_t number,char *suffix)

{
  pointer pcVar1;
  long in_FS_OFFSET;
  char buf [100];
  char acStack_98 [112];
  string *local_28;
  
  local_28 = *(string **)(in_FS_OFFSET + 0x28);
  snprintf(acStack_98,100,"/%06llu.%s",number,suffix);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + dbname->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,acStack_98);
  if (*(string **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(string **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::string MakeFileName(const std::string& dbname, uint64_t number,
                                const char* suffix) {
  char buf[100];
  snprintf(buf, sizeof(buf), "/%06llu.%s",
           static_cast<unsigned long long>(number), suffix);
  return dbname + buf;
}